

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglGLES2SharingThreadedTests.cpp
# Opt level: O3

void __thiscall
deqp::egl::GLES2ThreadedSharingTest::addTextureOperations(GLES2ThreadedSharingTest *this)

{
  deInt32 *pdVar1;
  EGLThread *pEVar2;
  SharedPtrStateBase *pSVar3;
  pointer ppEVar4;
  SharedPtr<deqp::egl::GLES2ThreadTest::Texture> *pSVar5;
  int iVar6;
  CreateShader *pCVar7;
  ShaderSource *pSVar8;
  ShaderCompile *pSVar9;
  CreateProgram *this_00;
  AttachShader *pAVar10;
  LinkProgram *this_01;
  CreateTexture *this_02;
  TexImage2D *pTVar11;
  CopyTexImage2D *pCVar12;
  TexSubImage2D *pTVar13;
  CopyTexSubImage2D *pCVar14;
  RenderTexture *pRVar15;
  ReadPixels *pRVar16;
  CompareData *this_03;
  DeleteTexture *pDVar17;
  DeleteShader *pDVar18;
  DeleteProgram *this_04;
  SharedPtr<deqp::egl::GLES2ThreadTest::Texture> texture;
  SharedPtr<deqp::egl::GLES2ThreadTest::Program> program;
  SharedPtr<deqp::egl::GLES2ThreadTest::Shader> fragmentShader;
  SharedPtr<deqp::egl::GLES2ThreadTest::Shader> vertexShader;
  SharedPtr<deqp::egl::GLES2ThreadTest::Program> local_208;
  SharedPtr<deqp::egl::GLES2ThreadTest::Shader> local_1f8;
  SharedPtr<deqp::egl::GLES2ThreadTest::Shader> local_1e8;
  SharedPtr<deqp::egl::GLES2ThreadTest::Texture> local_1d8;
  SharedPtr<deqp::egl::GLES2ThreadTest::Texture> local_1c8;
  SharedPtr<tcu::ThreadUtil::DataBlock> local_1b8;
  SharedPtr<tcu::ThreadUtil::DataBlock> local_1a8;
  SharedPtr<deqp::egl::GLES2ThreadTest::Program> local_198;
  SharedPtr<deqp::egl::GLES2ThreadTest::Shader> local_188;
  SharedPtr<deqp::egl::GLES2ThreadTest::Shader> local_178;
  SharedPtr<deqp::egl::GLES2ThreadTest::Shader> local_168;
  SharedPtr<deqp::egl::GLES2ThreadTest::Shader> local_158;
  SharedPtr<deqp::egl::GLES2ThreadTest::Texture> local_148;
  SharedPtr<deqp::egl::GLES2ThreadTest::Program> local_138;
  SharedPtr<deqp::egl::GLES2ThreadTest::Texture> local_128;
  SharedPtr<deqp::egl::GLES2ThreadTest::Program> local_118;
  SharedPtr<deqp::egl::GLES2ThreadTest::Texture> local_108;
  SharedPtr<deqp::egl::GLES2ThreadTest::Texture> local_f8;
  SharedPtr<deqp::egl::GLES2ThreadTest::Texture> local_e8;
  SharedPtr<deqp::egl::GLES2ThreadTest::Texture> local_d8;
  SharedPtr<deqp::egl::GLES2ThreadTest::Texture> local_c8;
  SharedPtr<deqp::egl::GLES2ThreadTest::Texture> local_b8;
  SharedPtr<deqp::egl::GLES2ThreadTest::Texture> local_a8;
  SharedPtr<deqp::egl::GLES2ThreadTest::Texture> local_98;
  SharedPtr<deqp::egl::GLES2ThreadTest::Shader> local_88;
  SharedPtr<deqp::egl::GLES2ThreadTest::Program> local_78;
  SharedPtr<deqp::egl::GLES2ThreadTest::Shader> local_68;
  SharedPtr<deqp::egl::GLES2ThreadTest::Program> local_58;
  SharedPtr<tcu::ThreadUtil::DataBlock> pixels2;
  SharedPtr<tcu::ThreadUtil::DataBlock> pixels1;
  
  vertexShader.m_ptr = (Shader *)0x0;
  vertexShader.m_state = (SharedPtrStateBase *)0x0;
  fragmentShader.m_ptr = (Shader *)0x0;
  fragmentShader.m_state = (SharedPtrStateBase *)0x0;
  program.m_ptr = (Program *)0x0;
  program.m_state = (SharedPtrStateBase *)0x0;
  if ((this->m_config).render == true) {
    pEVar2 = *(this->m_threads).
              super__Vector_base<deqp::egl::GLES2ThreadTest::EGLThread_*,_std::allocator<deqp::egl::GLES2ThreadTest::EGLThread_*>_>
              ._M_impl.super__Vector_impl_data._M_start;
    pCVar7 = (CreateShader *)operator_new(0x80);
    GLES2ThreadTest::CreateShader::CreateShader
              (pCVar7,0x8b31,&vertexShader,(this->m_config).useFenceSync,(this->m_config).serverSync
              );
    tcu::ThreadUtil::Thread::addOperation(&pEVar2->super_Thread,(Operation *)pCVar7);
    pEVar2 = *(this->m_threads).
              super__Vector_base<deqp::egl::GLES2ThreadTest::EGLThread_*,_std::allocator<deqp::egl::GLES2ThreadTest::EGLThread_*>_>
              ._M_impl.super__Vector_impl_data._M_start;
    pSVar8 = (ShaderSource *)operator_new(0x98);
    local_158.m_ptr = vertexShader.m_ptr;
    local_158.m_state = vertexShader.m_state;
    if (vertexShader.m_state != (SharedPtrStateBase *)0x0) {
      LOCK();
      (vertexShader.m_state)->strongRefCount = (vertexShader.m_state)->strongRefCount + 1;
      UNLOCK();
      LOCK();
      (vertexShader.m_state)->weakRefCount = (vertexShader.m_state)->weakRefCount + 1;
      UNLOCK();
    }
    GLES2ThreadTest::ShaderSource::ShaderSource
              (pSVar8,&local_158,
               "attribute highp vec2 a_pos;\nvarying mediump vec2 v_pos;\nvoid main(void)\n{\n\tv_pos = a_pos;\n\tgl_Position = vec4(a_pos, 0.0, 1.0);\n}\n"
               ,(this->m_config).useFenceSync,(this->m_config).serverSync);
    tcu::ThreadUtil::Thread::addOperation(&pEVar2->super_Thread,(Operation *)pSVar8);
    pSVar3 = local_158.m_state;
    if (local_158.m_state != (SharedPtrStateBase *)0x0) {
      LOCK();
      pdVar1 = &(local_158.m_state)->strongRefCount;
      *pdVar1 = *pdVar1 + -1;
      UNLOCK();
      if (*pdVar1 == 0) {
        local_158.m_ptr = (Shader *)0x0;
        (*(local_158.m_state)->_vptr_SharedPtrStateBase[2])(local_158.m_state);
      }
      LOCK();
      pdVar1 = &pSVar3->weakRefCount;
      *pdVar1 = *pdVar1 + -1;
      UNLOCK();
      if (*pdVar1 == 0) {
        if (local_158.m_state != (SharedPtrStateBase *)0x0) {
          (*(local_158.m_state)->_vptr_SharedPtrStateBase[1])();
        }
        local_158.m_state = (SharedPtrStateBase *)0x0;
      }
    }
    pEVar2 = *(this->m_threads).
              super__Vector_base<deqp::egl::GLES2ThreadTest::EGLThread_*,_std::allocator<deqp::egl::GLES2ThreadTest::EGLThread_*>_>
              ._M_impl.super__Vector_impl_data._M_start;
    pSVar9 = (ShaderCompile *)operator_new(0x78);
    local_168.m_ptr = vertexShader.m_ptr;
    local_168.m_state = vertexShader.m_state;
    if (vertexShader.m_state != (SharedPtrStateBase *)0x0) {
      LOCK();
      (vertexShader.m_state)->strongRefCount = (vertexShader.m_state)->strongRefCount + 1;
      UNLOCK();
      LOCK();
      (vertexShader.m_state)->weakRefCount = (vertexShader.m_state)->weakRefCount + 1;
      UNLOCK();
    }
    GLES2ThreadTest::ShaderCompile::ShaderCompile
              (pSVar9,&local_168,(this->m_config).useFenceSync,(this->m_config).serverSync);
    tcu::ThreadUtil::Thread::addOperation(&pEVar2->super_Thread,(Operation *)pSVar9);
    pSVar3 = local_168.m_state;
    if (local_168.m_state != (SharedPtrStateBase *)0x0) {
      LOCK();
      pdVar1 = &(local_168.m_state)->strongRefCount;
      *pdVar1 = *pdVar1 + -1;
      UNLOCK();
      if (*pdVar1 == 0) {
        local_168.m_ptr = (Shader *)0x0;
        (*(local_168.m_state)->_vptr_SharedPtrStateBase[2])(local_168.m_state);
      }
      LOCK();
      pdVar1 = &pSVar3->weakRefCount;
      *pdVar1 = *pdVar1 + -1;
      UNLOCK();
      if (*pdVar1 == 0) {
        if (local_168.m_state != (SharedPtrStateBase *)0x0) {
          (*(local_168.m_state)->_vptr_SharedPtrStateBase[1])();
        }
        local_168.m_state = (SharedPtrStateBase *)0x0;
      }
    }
    pEVar2 = *(this->m_threads).
              super__Vector_base<deqp::egl::GLES2ThreadTest::EGLThread_*,_std::allocator<deqp::egl::GLES2ThreadTest::EGLThread_*>_>
              ._M_impl.super__Vector_impl_data._M_start;
    pCVar7 = (CreateShader *)operator_new(0x80);
    GLES2ThreadTest::CreateShader::CreateShader
              (pCVar7,0x8b30,&fragmentShader,(this->m_config).useFenceSync,
               (this->m_config).serverSync);
    tcu::ThreadUtil::Thread::addOperation(&pEVar2->super_Thread,(Operation *)pCVar7);
    pEVar2 = *(this->m_threads).
              super__Vector_base<deqp::egl::GLES2ThreadTest::EGLThread_*,_std::allocator<deqp::egl::GLES2ThreadTest::EGLThread_*>_>
              ._M_impl.super__Vector_impl_data._M_start;
    pSVar8 = (ShaderSource *)operator_new(0x98);
    local_178.m_ptr = fragmentShader.m_ptr;
    local_178.m_state = fragmentShader.m_state;
    if (fragmentShader.m_state != (SharedPtrStateBase *)0x0) {
      LOCK();
      (fragmentShader.m_state)->strongRefCount = (fragmentShader.m_state)->strongRefCount + 1;
      UNLOCK();
      LOCK();
      (fragmentShader.m_state)->weakRefCount = (fragmentShader.m_state)->weakRefCount + 1;
      UNLOCK();
    }
    GLES2ThreadTest::ShaderSource::ShaderSource
              (pSVar8,&local_178,
               "varying mediump vec2 v_pos;\nuniform sampler2D u_sampler;\nvoid main(void)\n{\n\tgl_FragColor = texture2D(u_sampler, v_pos);\n}\n"
               ,(this->m_config).useFenceSync,(this->m_config).serverSync);
    tcu::ThreadUtil::Thread::addOperation(&pEVar2->super_Thread,(Operation *)pSVar8);
    pSVar3 = local_178.m_state;
    if (local_178.m_state != (SharedPtrStateBase *)0x0) {
      LOCK();
      pdVar1 = &(local_178.m_state)->strongRefCount;
      *pdVar1 = *pdVar1 + -1;
      UNLOCK();
      if (*pdVar1 == 0) {
        local_178.m_ptr = (Shader *)0x0;
        (*(local_178.m_state)->_vptr_SharedPtrStateBase[2])(local_178.m_state);
      }
      LOCK();
      pdVar1 = &pSVar3->weakRefCount;
      *pdVar1 = *pdVar1 + -1;
      UNLOCK();
      if (*pdVar1 == 0) {
        if (local_178.m_state != (SharedPtrStateBase *)0x0) {
          (*(local_178.m_state)->_vptr_SharedPtrStateBase[1])();
        }
        local_178.m_state = (SharedPtrStateBase *)0x0;
      }
    }
    pEVar2 = *(this->m_threads).
              super__Vector_base<deqp::egl::GLES2ThreadTest::EGLThread_*,_std::allocator<deqp::egl::GLES2ThreadTest::EGLThread_*>_>
              ._M_impl.super__Vector_impl_data._M_start;
    pSVar9 = (ShaderCompile *)operator_new(0x78);
    local_188.m_ptr = fragmentShader.m_ptr;
    local_188.m_state = fragmentShader.m_state;
    if (fragmentShader.m_state != (SharedPtrStateBase *)0x0) {
      LOCK();
      (fragmentShader.m_state)->strongRefCount = (fragmentShader.m_state)->strongRefCount + 1;
      UNLOCK();
      LOCK();
      (fragmentShader.m_state)->weakRefCount = (fragmentShader.m_state)->weakRefCount + 1;
      UNLOCK();
    }
    GLES2ThreadTest::ShaderCompile::ShaderCompile
              (pSVar9,&local_188,(this->m_config).useFenceSync,(this->m_config).serverSync);
    tcu::ThreadUtil::Thread::addOperation(&pEVar2->super_Thread,(Operation *)pSVar9);
    pSVar3 = local_188.m_state;
    if (local_188.m_state != (SharedPtrStateBase *)0x0) {
      LOCK();
      pdVar1 = &(local_188.m_state)->strongRefCount;
      *pdVar1 = *pdVar1 + -1;
      UNLOCK();
      if (*pdVar1 == 0) {
        local_188.m_ptr = (Shader *)0x0;
        (*(local_188.m_state)->_vptr_SharedPtrStateBase[2])(local_188.m_state);
      }
      LOCK();
      pdVar1 = &pSVar3->weakRefCount;
      *pdVar1 = *pdVar1 + -1;
      UNLOCK();
      if (*pdVar1 == 0) {
        if (local_188.m_state != (SharedPtrStateBase *)0x0) {
          (*(local_188.m_state)->_vptr_SharedPtrStateBase[1])();
        }
        local_188.m_state = (SharedPtrStateBase *)0x0;
      }
    }
    pEVar2 = *(this->m_threads).
              super__Vector_base<deqp::egl::GLES2ThreadTest::EGLThread_*,_std::allocator<deqp::egl::GLES2ThreadTest::EGLThread_*>_>
              ._M_impl.super__Vector_impl_data._M_start;
    this_00 = (CreateProgram *)operator_new(0x78);
    GLES2ThreadTest::CreateProgram::CreateProgram
              (this_00,&program,(this->m_config).useFenceSync,(this->m_config).serverSync);
    tcu::ThreadUtil::Thread::addOperation(&pEVar2->super_Thread,(Operation *)this_00);
    pEVar2 = *(this->m_threads).
              super__Vector_base<deqp::egl::GLES2ThreadTest::EGLThread_*,_std::allocator<deqp::egl::GLES2ThreadTest::EGLThread_*>_>
              ._M_impl.super__Vector_impl_data._M_start;
    pAVar10 = (AttachShader *)operator_new(0x88);
    local_58.m_ptr = program.m_ptr;
    local_58.m_state = program.m_state;
    if (program.m_state != (SharedPtrStateBase *)0x0) {
      LOCK();
      (program.m_state)->strongRefCount = (program.m_state)->strongRefCount + 1;
      UNLOCK();
      LOCK();
      (program.m_state)->weakRefCount = (program.m_state)->weakRefCount + 1;
      UNLOCK();
    }
    local_68.m_ptr = fragmentShader.m_ptr;
    local_68.m_state = fragmentShader.m_state;
    if (fragmentShader.m_state != (SharedPtrStateBase *)0x0) {
      LOCK();
      (fragmentShader.m_state)->strongRefCount = (fragmentShader.m_state)->strongRefCount + 1;
      UNLOCK();
      LOCK();
      (fragmentShader.m_state)->weakRefCount = (fragmentShader.m_state)->weakRefCount + 1;
      UNLOCK();
    }
    GLES2ThreadTest::AttachShader::AttachShader
              (pAVar10,&local_58,&local_68,(this->m_config).useFenceSync,(this->m_config).serverSync
              );
    tcu::ThreadUtil::Thread::addOperation(&pEVar2->super_Thread,(Operation *)pAVar10);
    pSVar3 = local_68.m_state;
    if (local_68.m_state != (SharedPtrStateBase *)0x0) {
      LOCK();
      pdVar1 = &(local_68.m_state)->strongRefCount;
      *pdVar1 = *pdVar1 + -1;
      UNLOCK();
      if (*pdVar1 == 0) {
        local_68.m_ptr = (Shader *)0x0;
        (*(local_68.m_state)->_vptr_SharedPtrStateBase[2])(local_68.m_state);
      }
      LOCK();
      pdVar1 = &pSVar3->weakRefCount;
      *pdVar1 = *pdVar1 + -1;
      UNLOCK();
      if (*pdVar1 == 0) {
        if (local_68.m_state != (SharedPtrStateBase *)0x0) {
          (*(local_68.m_state)->_vptr_SharedPtrStateBase[1])();
        }
        local_68.m_state = (SharedPtrStateBase *)0x0;
      }
    }
    pSVar3 = local_58.m_state;
    if (local_58.m_state != (SharedPtrStateBase *)0x0) {
      LOCK();
      pdVar1 = &(local_58.m_state)->strongRefCount;
      *pdVar1 = *pdVar1 + -1;
      UNLOCK();
      if (*pdVar1 == 0) {
        local_58.m_ptr = (Program *)0x0;
        (*(local_58.m_state)->_vptr_SharedPtrStateBase[2])(local_58.m_state);
      }
      LOCK();
      pdVar1 = &pSVar3->weakRefCount;
      *pdVar1 = *pdVar1 + -1;
      UNLOCK();
      if (*pdVar1 == 0) {
        if (local_58.m_state != (SharedPtrStateBase *)0x0) {
          (*(local_58.m_state)->_vptr_SharedPtrStateBase[1])();
        }
        local_58.m_state = (SharedPtrStateBase *)0x0;
      }
    }
    pEVar2 = *(this->m_threads).
              super__Vector_base<deqp::egl::GLES2ThreadTest::EGLThread_*,_std::allocator<deqp::egl::GLES2ThreadTest::EGLThread_*>_>
              ._M_impl.super__Vector_impl_data._M_start;
    pAVar10 = (AttachShader *)operator_new(0x88);
    local_78.m_ptr = program.m_ptr;
    local_78.m_state = program.m_state;
    if (program.m_state != (SharedPtrStateBase *)0x0) {
      LOCK();
      (program.m_state)->strongRefCount = (program.m_state)->strongRefCount + 1;
      UNLOCK();
      LOCK();
      (program.m_state)->weakRefCount = (program.m_state)->weakRefCount + 1;
      UNLOCK();
    }
    local_88.m_ptr = vertexShader.m_ptr;
    local_88.m_state = vertexShader.m_state;
    if (vertexShader.m_state != (SharedPtrStateBase *)0x0) {
      LOCK();
      (vertexShader.m_state)->strongRefCount = (vertexShader.m_state)->strongRefCount + 1;
      UNLOCK();
      LOCK();
      (vertexShader.m_state)->weakRefCount = (vertexShader.m_state)->weakRefCount + 1;
      UNLOCK();
    }
    GLES2ThreadTest::AttachShader::AttachShader
              (pAVar10,&local_78,&local_88,(this->m_config).useFenceSync,(this->m_config).serverSync
              );
    tcu::ThreadUtil::Thread::addOperation(&pEVar2->super_Thread,(Operation *)pAVar10);
    pSVar3 = local_88.m_state;
    if (local_88.m_state != (SharedPtrStateBase *)0x0) {
      LOCK();
      pdVar1 = &(local_88.m_state)->strongRefCount;
      *pdVar1 = *pdVar1 + -1;
      UNLOCK();
      if (*pdVar1 == 0) {
        local_88.m_ptr = (Shader *)0x0;
        (*(local_88.m_state)->_vptr_SharedPtrStateBase[2])(local_88.m_state);
      }
      LOCK();
      pdVar1 = &pSVar3->weakRefCount;
      *pdVar1 = *pdVar1 + -1;
      UNLOCK();
      if (*pdVar1 == 0) {
        if (local_88.m_state != (SharedPtrStateBase *)0x0) {
          (*(local_88.m_state)->_vptr_SharedPtrStateBase[1])();
        }
        local_88.m_state = (SharedPtrStateBase *)0x0;
      }
    }
    pSVar3 = local_78.m_state;
    if (local_78.m_state != (SharedPtrStateBase *)0x0) {
      LOCK();
      pdVar1 = &(local_78.m_state)->strongRefCount;
      *pdVar1 = *pdVar1 + -1;
      UNLOCK();
      if (*pdVar1 == 0) {
        local_78.m_ptr = (Program *)0x0;
        (*(local_78.m_state)->_vptr_SharedPtrStateBase[2])(local_78.m_state);
      }
      LOCK();
      pdVar1 = &pSVar3->weakRefCount;
      *pdVar1 = *pdVar1 + -1;
      UNLOCK();
      if (*pdVar1 == 0) {
        if (local_78.m_state != (SharedPtrStateBase *)0x0) {
          (*(local_78.m_state)->_vptr_SharedPtrStateBase[1])();
        }
        local_78.m_state = (SharedPtrStateBase *)0x0;
      }
    }
    pEVar2 = *(this->m_threads).
              super__Vector_base<deqp::egl::GLES2ThreadTest::EGLThread_*,_std::allocator<deqp::egl::GLES2ThreadTest::EGLThread_*>_>
              ._M_impl.super__Vector_impl_data._M_start;
    this_01 = (LinkProgram *)operator_new(0x78);
    local_198.m_ptr = program.m_ptr;
    local_198.m_state = program.m_state;
    if (program.m_state != (SharedPtrStateBase *)0x0) {
      LOCK();
      (program.m_state)->strongRefCount = (program.m_state)->strongRefCount + 1;
      UNLOCK();
      LOCK();
      (program.m_state)->weakRefCount = (program.m_state)->weakRefCount + 1;
      UNLOCK();
    }
    GLES2ThreadTest::LinkProgram::LinkProgram
              (this_01,&local_198,(this->m_config).useFenceSync,(this->m_config).serverSync);
    tcu::ThreadUtil::Thread::addOperation(&pEVar2->super_Thread,(Operation *)this_01);
    pSVar3 = local_198.m_state;
    if (local_198.m_state != (SharedPtrStateBase *)0x0) {
      LOCK();
      pdVar1 = &(local_198.m_state)->strongRefCount;
      *pdVar1 = *pdVar1 + -1;
      UNLOCK();
      if (*pdVar1 == 0) {
        local_198.m_ptr = (Program *)0x0;
        (*(local_198.m_state)->_vptr_SharedPtrStateBase[2])(local_198.m_state);
      }
      LOCK();
      pdVar1 = &pSVar3->weakRefCount;
      *pdVar1 = *pdVar1 + -1;
      UNLOCK();
      if (*pdVar1 == 0) {
        if (local_198.m_state != (SharedPtrStateBase *)0x0) {
          (*(local_198.m_state)->_vptr_SharedPtrStateBase[1])();
        }
        local_198.m_state = (SharedPtrStateBase *)0x0;
      }
    }
  }
  texture.m_ptr = (Texture *)0x0;
  texture.m_state = (SharedPtrStateBase *)0x0;
  pEVar2 = *(this->m_threads).
            super__Vector_base<deqp::egl::GLES2ThreadTest::EGLThread_*,_std::allocator<deqp::egl::GLES2ThreadTest::EGLThread_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  this_02 = (CreateTexture *)operator_new(0x78);
  GLES2ThreadTest::CreateTexture::CreateTexture
            (this_02,&texture,(this->m_config).useFenceSync,(this->m_config).serverSync);
  tcu::ThreadUtil::Thread::addOperation(&pEVar2->super_Thread,(Operation *)this_02);
  iVar6 = (this->m_config).define;
  if (iVar6 == 1) {
    if (((this->m_config).modify == 0) && ((this->m_config).render != true)) {
      pEVar2 = (this->m_threads).
               super__Vector_base<deqp::egl::GLES2ThreadTest::EGLThread_*,_std::allocator<deqp::egl::GLES2ThreadTest::EGLThread_*>_>
               ._M_impl.super__Vector_impl_data._M_start[1];
      pTVar11 = (TexImage2D *)operator_new(0x90);
      local_a8.m_ptr = texture.m_ptr;
      local_a8.m_state = texture.m_state;
      if (texture.m_state != (SharedPtrStateBase *)0x0) {
        LOCK();
        (texture.m_state)->strongRefCount = (texture.m_state)->strongRefCount + 1;
        UNLOCK();
        LOCK();
        (texture.m_state)->weakRefCount = (texture.m_state)->weakRefCount + 1;
        UNLOCK();
      }
      GLES2ThreadTest::TexImage2D::TexImage2D
                (pTVar11,&local_a8,0,0x1908,0x100,0x100,0x1908,0x1401,(this->m_config).useFenceSync,
                 (this->m_config).serverSync);
      tcu::ThreadUtil::Thread::addOperation(&pEVar2->super_Thread,(Operation *)pTVar11);
      pSVar3 = local_a8.m_state;
      if (local_a8.m_state != (SharedPtrStateBase *)0x0) {
        LOCK();
        pdVar1 = &(local_a8.m_state)->strongRefCount;
        *pdVar1 = *pdVar1 + -1;
        UNLOCK();
        if (*pdVar1 == 0) {
          local_a8.m_ptr = (Texture *)0x0;
          (*(local_a8.m_state)->_vptr_SharedPtrStateBase[2])(local_a8.m_state);
        }
        LOCK();
        pdVar1 = &pSVar3->weakRefCount;
        *pdVar1 = *pdVar1 + -1;
        UNLOCK();
        if (*pdVar1 == 0) {
          pSVar5 = &local_a8;
          goto LAB_001d3e6e;
        }
      }
    }
    else {
      pEVar2 = *(this->m_threads).
                super__Vector_base<deqp::egl::GLES2ThreadTest::EGLThread_*,_std::allocator<deqp::egl::GLES2ThreadTest::EGLThread_*>_>
                ._M_impl.super__Vector_impl_data._M_start;
      pTVar11 = (TexImage2D *)operator_new(0x90);
      local_98.m_ptr = texture.m_ptr;
      local_98.m_state = texture.m_state;
      if (texture.m_state != (SharedPtrStateBase *)0x0) {
        LOCK();
        (texture.m_state)->strongRefCount = (texture.m_state)->strongRefCount + 1;
        UNLOCK();
        LOCK();
        (texture.m_state)->weakRefCount = (texture.m_state)->weakRefCount + 1;
        UNLOCK();
      }
      GLES2ThreadTest::TexImage2D::TexImage2D
                (pTVar11,&local_98,0,0x1908,0x100,0x100,0x1908,0x1401,(this->m_config).useFenceSync,
                 (this->m_config).serverSync);
      tcu::ThreadUtil::Thread::addOperation(&pEVar2->super_Thread,(Operation *)pTVar11);
      pSVar3 = local_98.m_state;
      if (local_98.m_state != (SharedPtrStateBase *)0x0) {
        LOCK();
        pdVar1 = &(local_98.m_state)->strongRefCount;
        *pdVar1 = *pdVar1 + -1;
        UNLOCK();
        if (*pdVar1 == 0) {
          local_98.m_ptr = (Texture *)0x0;
          (*(local_98.m_state)->_vptr_SharedPtrStateBase[2])(local_98.m_state);
        }
        LOCK();
        pdVar1 = &pSVar3->weakRefCount;
        *pdVar1 = *pdVar1 + -1;
        UNLOCK();
        if (*pdVar1 == 0) {
          pSVar5 = &local_98;
LAB_001d3e6e:
          pSVar3 = pSVar5->m_state;
          if (pSVar3 != (SharedPtrStateBase *)0x0) {
            (*pSVar3->_vptr_SharedPtrStateBase[1])();
          }
          pSVar5->m_state = (SharedPtrStateBase *)0x0;
        }
      }
    }
    iVar6 = (this->m_config).define;
  }
  if (iVar6 == 2) {
    if (((this->m_config).modify == 0) && ((this->m_config).render != true)) {
      pEVar2 = (this->m_threads).
               super__Vector_base<deqp::egl::GLES2ThreadTest::EGLThread_*,_std::allocator<deqp::egl::GLES2ThreadTest::EGLThread_*>_>
               ._M_impl.super__Vector_impl_data._M_start[1];
      pCVar12 = (CopyTexImage2D *)operator_new(0x98);
      local_c8.m_ptr = texture.m_ptr;
      local_c8.m_state = texture.m_state;
      if (texture.m_state != (SharedPtrStateBase *)0x0) {
        LOCK();
        (texture.m_state)->strongRefCount = (texture.m_state)->strongRefCount + 1;
        UNLOCK();
        LOCK();
        (texture.m_state)->weakRefCount = (texture.m_state)->weakRefCount + 1;
        UNLOCK();
      }
      GLES2ThreadTest::CopyTexImage2D::CopyTexImage2D
                (pCVar12,&local_c8,0,0x1908,0x11,0x11,0x100,0x100,0,(this->m_config).useFenceSync,
                 (this->m_config).serverSync);
      tcu::ThreadUtil::Thread::addOperation(&pEVar2->super_Thread,(Operation *)pCVar12);
      pSVar3 = local_c8.m_state;
      if (local_c8.m_state != (SharedPtrStateBase *)0x0) {
        LOCK();
        pdVar1 = &(local_c8.m_state)->strongRefCount;
        *pdVar1 = *pdVar1 + -1;
        UNLOCK();
        if (*pdVar1 == 0) {
          local_c8.m_ptr = (Texture *)0x0;
          (*(local_c8.m_state)->_vptr_SharedPtrStateBase[2])(local_c8.m_state);
        }
        LOCK();
        pdVar1 = &pSVar3->weakRefCount;
        *pdVar1 = *pdVar1 + -1;
        UNLOCK();
        if (*pdVar1 == 0) {
          pSVar5 = &local_c8;
          goto LAB_001d3f80;
        }
      }
    }
    else {
      pEVar2 = *(this->m_threads).
                super__Vector_base<deqp::egl::GLES2ThreadTest::EGLThread_*,_std::allocator<deqp::egl::GLES2ThreadTest::EGLThread_*>_>
                ._M_impl.super__Vector_impl_data._M_start;
      pCVar12 = (CopyTexImage2D *)operator_new(0x98);
      local_b8.m_ptr = texture.m_ptr;
      local_b8.m_state = texture.m_state;
      if (texture.m_state != (SharedPtrStateBase *)0x0) {
        LOCK();
        (texture.m_state)->strongRefCount = (texture.m_state)->strongRefCount + 1;
        UNLOCK();
        LOCK();
        (texture.m_state)->weakRefCount = (texture.m_state)->weakRefCount + 1;
        UNLOCK();
      }
      GLES2ThreadTest::CopyTexImage2D::CopyTexImage2D
                (pCVar12,&local_b8,0,0x1908,0x11,0x11,0x100,0x100,0,(this->m_config).useFenceSync,
                 (this->m_config).serverSync);
      tcu::ThreadUtil::Thread::addOperation(&pEVar2->super_Thread,(Operation *)pCVar12);
      pSVar3 = local_b8.m_state;
      if (local_b8.m_state != (SharedPtrStateBase *)0x0) {
        LOCK();
        pdVar1 = &(local_b8.m_state)->strongRefCount;
        *pdVar1 = *pdVar1 + -1;
        UNLOCK();
        if (*pdVar1 == 0) {
          local_b8.m_ptr = (Texture *)0x0;
          (*(local_b8.m_state)->_vptr_SharedPtrStateBase[2])(local_b8.m_state);
        }
        LOCK();
        pdVar1 = &pSVar3->weakRefCount;
        *pdVar1 = *pdVar1 + -1;
        UNLOCK();
        if (*pdVar1 == 0) {
          pSVar5 = &local_b8;
LAB_001d3f80:
          pSVar3 = pSVar5->m_state;
          if (pSVar3 != (SharedPtrStateBase *)0x0) {
            (*pSVar3->_vptr_SharedPtrStateBase[1])();
          }
          pSVar5->m_state = (SharedPtrStateBase *)0x0;
        }
      }
    }
  }
  iVar6 = (this->m_config).modify;
  if (iVar6 == 1) {
    ppEVar4 = (this->m_threads).
              super__Vector_base<deqp::egl::GLES2ThreadTest::EGLThread_*,_std::allocator<deqp::egl::GLES2ThreadTest::EGLThread_*>_>
              ._M_impl.super__Vector_impl_data._M_start;
    if ((this->m_config).render == true) {
      pEVar2 = *ppEVar4;
      pTVar13 = (TexSubImage2D *)operator_new(0x98);
      local_d8.m_ptr = texture.m_ptr;
      local_d8.m_state = texture.m_state;
      if (texture.m_state != (SharedPtrStateBase *)0x0) {
        LOCK();
        (texture.m_state)->strongRefCount = (texture.m_state)->strongRefCount + 1;
        UNLOCK();
        LOCK();
        (texture.m_state)->weakRefCount = (texture.m_state)->weakRefCount + 1;
        UNLOCK();
      }
      GLES2ThreadTest::TexSubImage2D::TexSubImage2D
                (pTVar13,&local_d8,0,0x11,0x11,0x1d,0x1d,0x1908,0x1401,(this->m_config).useFenceSync
                 ,(this->m_config).serverSync);
      tcu::ThreadUtil::Thread::addOperation(&pEVar2->super_Thread,(Operation *)pTVar13);
      pSVar3 = local_d8.m_state;
      if (local_d8.m_state != (SharedPtrStateBase *)0x0) {
        LOCK();
        pdVar1 = &(local_d8.m_state)->strongRefCount;
        *pdVar1 = *pdVar1 + -1;
        UNLOCK();
        if (*pdVar1 == 0) {
          local_d8.m_ptr = (Texture *)0x0;
          (*(local_d8.m_state)->_vptr_SharedPtrStateBase[2])(local_d8.m_state);
        }
        LOCK();
        pdVar1 = &pSVar3->weakRefCount;
        *pdVar1 = *pdVar1 + -1;
        UNLOCK();
        if (*pdVar1 == 0) {
          pSVar5 = &local_d8;
LAB_001d4168:
          pSVar3 = pSVar5->m_state;
          if (pSVar3 != (SharedPtrStateBase *)0x0) {
            (*pSVar3->_vptr_SharedPtrStateBase[1])();
          }
          pSVar5->m_state = (SharedPtrStateBase *)0x0;
        }
      }
    }
    else {
      pEVar2 = ppEVar4[1];
      pTVar13 = (TexSubImage2D *)operator_new(0x98);
      local_e8.m_ptr = texture.m_ptr;
      local_e8.m_state = texture.m_state;
      if (texture.m_state != (SharedPtrStateBase *)0x0) {
        LOCK();
        (texture.m_state)->strongRefCount = (texture.m_state)->strongRefCount + 1;
        UNLOCK();
        LOCK();
        (texture.m_state)->weakRefCount = (texture.m_state)->weakRefCount + 1;
        UNLOCK();
      }
      GLES2ThreadTest::TexSubImage2D::TexSubImage2D
                (pTVar13,&local_e8,0,0x11,0x11,0x1d,0x1d,0x1908,0x1401,(this->m_config).useFenceSync
                 ,(this->m_config).serverSync);
      tcu::ThreadUtil::Thread::addOperation(&pEVar2->super_Thread,(Operation *)pTVar13);
      pSVar3 = local_e8.m_state;
      if (local_e8.m_state != (SharedPtrStateBase *)0x0) {
        LOCK();
        pdVar1 = &(local_e8.m_state)->strongRefCount;
        *pdVar1 = *pdVar1 + -1;
        UNLOCK();
        if (*pdVar1 == 0) {
          local_e8.m_ptr = (Texture *)0x0;
          (*(local_e8.m_state)->_vptr_SharedPtrStateBase[2])(local_e8.m_state);
        }
        LOCK();
        pdVar1 = &pSVar3->weakRefCount;
        *pdVar1 = *pdVar1 + -1;
        UNLOCK();
        if (*pdVar1 == 0) {
          pSVar5 = &local_e8;
          goto LAB_001d4168;
        }
      }
    }
    iVar6 = (this->m_config).modify;
  }
  if (iVar6 == 2) {
    ppEVar4 = (this->m_threads).
              super__Vector_base<deqp::egl::GLES2ThreadTest::EGLThread_*,_std::allocator<deqp::egl::GLES2ThreadTest::EGLThread_*>_>
              ._M_impl.super__Vector_impl_data._M_start;
    if ((this->m_config).render == true) {
      pEVar2 = *ppEVar4;
      pCVar14 = (CopyTexSubImage2D *)operator_new(0x98);
      local_f8.m_ptr = texture.m_ptr;
      local_f8.m_state = texture.m_state;
      if (texture.m_state != (SharedPtrStateBase *)0x0) {
        LOCK();
        (texture.m_state)->strongRefCount = (texture.m_state)->strongRefCount + 1;
        UNLOCK();
        LOCK();
        (texture.m_state)->weakRefCount = (texture.m_state)->weakRefCount + 1;
        UNLOCK();
      }
      GLES2ThreadTest::CopyTexSubImage2D::CopyTexSubImage2D
                (pCVar14,&local_f8,0,7,7,0x11,0x11,0x1d,0x1d,(this->m_config).useFenceSync,
                 (this->m_config).serverSync);
      tcu::ThreadUtil::Thread::addOperation(&pEVar2->super_Thread,(Operation *)pCVar14);
      pSVar3 = local_f8.m_state;
      if (local_f8.m_state != (SharedPtrStateBase *)0x0) {
        LOCK();
        pdVar1 = &(local_f8.m_state)->strongRefCount;
        *pdVar1 = *pdVar1 + -1;
        UNLOCK();
        if (*pdVar1 == 0) {
          local_f8.m_ptr = (Texture *)0x0;
          (*(local_f8.m_state)->_vptr_SharedPtrStateBase[2])(local_f8.m_state);
        }
        LOCK();
        pdVar1 = &pSVar3->weakRefCount;
        *pdVar1 = *pdVar1 + -1;
        UNLOCK();
        if (*pdVar1 == 0) {
          pSVar5 = &local_f8;
LAB_001d4350:
          pSVar3 = pSVar5->m_state;
          if (pSVar3 != (SharedPtrStateBase *)0x0) {
            (*pSVar3->_vptr_SharedPtrStateBase[1])();
          }
          pSVar5->m_state = (SharedPtrStateBase *)0x0;
        }
      }
    }
    else {
      pEVar2 = ppEVar4[1];
      pCVar14 = (CopyTexSubImage2D *)operator_new(0x98);
      local_108.m_ptr = texture.m_ptr;
      local_108.m_state = texture.m_state;
      if (texture.m_state != (SharedPtrStateBase *)0x0) {
        LOCK();
        (texture.m_state)->strongRefCount = (texture.m_state)->strongRefCount + 1;
        UNLOCK();
        LOCK();
        (texture.m_state)->weakRefCount = (texture.m_state)->weakRefCount + 1;
        UNLOCK();
      }
      GLES2ThreadTest::CopyTexSubImage2D::CopyTexSubImage2D
                (pCVar14,&local_108,0,7,7,0x11,0x11,0x1d,0x1d,(this->m_config).useFenceSync,
                 (this->m_config).serverSync);
      tcu::ThreadUtil::Thread::addOperation(&pEVar2->super_Thread,(Operation *)pCVar14);
      pSVar3 = local_108.m_state;
      if (local_108.m_state != (SharedPtrStateBase *)0x0) {
        LOCK();
        pdVar1 = &(local_108.m_state)->strongRefCount;
        *pdVar1 = *pdVar1 + -1;
        UNLOCK();
        if (*pdVar1 == 0) {
          local_108.m_ptr = (Texture *)0x0;
          (*(local_108.m_state)->_vptr_SharedPtrStateBase[2])(local_108.m_state);
        }
        LOCK();
        pdVar1 = &pSVar3->weakRefCount;
        *pdVar1 = *pdVar1 + -1;
        UNLOCK();
        if (*pdVar1 == 0) {
          pSVar5 = &local_108;
          goto LAB_001d4350;
        }
      }
    }
  }
  if ((this->m_config).render == true) {
    pixels1.m_ptr = (DataBlock *)0x0;
    pixels1.m_state = (SharedPtrStateBase *)0x0;
    pixels2.m_ptr = (DataBlock *)0x0;
    pixels2.m_state = (SharedPtrStateBase *)0x0;
    pEVar2 = *(this->m_threads).
              super__Vector_base<deqp::egl::GLES2ThreadTest::EGLThread_*,_std::allocator<deqp::egl::GLES2ThreadTest::EGLThread_*>_>
              ._M_impl.super__Vector_impl_data._M_start;
    pRVar15 = (RenderTexture *)operator_new(0x88);
    local_118.m_ptr = program.m_ptr;
    local_118.m_state = program.m_state;
    if (program.m_state != (SharedPtrStateBase *)0x0) {
      LOCK();
      (program.m_state)->strongRefCount = (program.m_state)->strongRefCount + 1;
      UNLOCK();
      LOCK();
      (program.m_state)->weakRefCount = (program.m_state)->weakRefCount + 1;
      UNLOCK();
    }
    local_128.m_ptr = texture.m_ptr;
    local_128.m_state = texture.m_state;
    if (texture.m_state != (SharedPtrStateBase *)0x0) {
      LOCK();
      (texture.m_state)->strongRefCount = (texture.m_state)->strongRefCount + 1;
      UNLOCK();
      LOCK();
      (texture.m_state)->weakRefCount = (texture.m_state)->weakRefCount + 1;
      UNLOCK();
    }
    GLES2ThreadTest::RenderTexture::RenderTexture
              (pRVar15,&local_118,&local_128,(this->m_config).useFenceSync,
               (this->m_config).serverSync);
    tcu::ThreadUtil::Thread::addOperation(&pEVar2->super_Thread,(Operation *)pRVar15);
    pSVar3 = local_128.m_state;
    if (local_128.m_state != (SharedPtrStateBase *)0x0) {
      LOCK();
      pdVar1 = &(local_128.m_state)->strongRefCount;
      *pdVar1 = *pdVar1 + -1;
      UNLOCK();
      if (*pdVar1 == 0) {
        local_128.m_ptr = (Texture *)0x0;
        (*(local_128.m_state)->_vptr_SharedPtrStateBase[2])(local_128.m_state);
      }
      LOCK();
      pdVar1 = &pSVar3->weakRefCount;
      *pdVar1 = *pdVar1 + -1;
      UNLOCK();
      if (*pdVar1 == 0) {
        if (local_128.m_state != (SharedPtrStateBase *)0x0) {
          (*(local_128.m_state)->_vptr_SharedPtrStateBase[1])();
        }
        local_128.m_state = (SharedPtrStateBase *)0x0;
      }
    }
    pSVar3 = local_118.m_state;
    if (local_118.m_state != (SharedPtrStateBase *)0x0) {
      LOCK();
      pdVar1 = &(local_118.m_state)->strongRefCount;
      *pdVar1 = *pdVar1 + -1;
      UNLOCK();
      if (*pdVar1 == 0) {
        local_118.m_ptr = (Program *)0x0;
        (*(local_118.m_state)->_vptr_SharedPtrStateBase[2])(local_118.m_state);
      }
      LOCK();
      pdVar1 = &pSVar3->weakRefCount;
      *pdVar1 = *pdVar1 + -1;
      UNLOCK();
      if (*pdVar1 == 0) {
        if (local_118.m_state != (SharedPtrStateBase *)0x0) {
          (*(local_118.m_state)->_vptr_SharedPtrStateBase[1])();
        }
        local_118.m_state = (SharedPtrStateBase *)0x0;
      }
    }
    pEVar2 = (this->m_threads).
             super__Vector_base<deqp::egl::GLES2ThreadTest::EGLThread_*,_std::allocator<deqp::egl::GLES2ThreadTest::EGLThread_*>_>
             ._M_impl.super__Vector_impl_data._M_start[1];
    pRVar15 = (RenderTexture *)operator_new(0x88);
    local_138.m_ptr = program.m_ptr;
    local_138.m_state = program.m_state;
    if (program.m_state != (SharedPtrStateBase *)0x0) {
      LOCK();
      (program.m_state)->strongRefCount = (program.m_state)->strongRefCount + 1;
      UNLOCK();
      LOCK();
      (program.m_state)->weakRefCount = (program.m_state)->weakRefCount + 1;
      UNLOCK();
    }
    local_148.m_ptr = texture.m_ptr;
    local_148.m_state = texture.m_state;
    if (texture.m_state != (SharedPtrStateBase *)0x0) {
      LOCK();
      (texture.m_state)->strongRefCount = (texture.m_state)->strongRefCount + 1;
      UNLOCK();
      LOCK();
      (texture.m_state)->weakRefCount = (texture.m_state)->weakRefCount + 1;
      UNLOCK();
    }
    GLES2ThreadTest::RenderTexture::RenderTexture
              (pRVar15,&local_138,&local_148,(this->m_config).useFenceSync,
               (this->m_config).serverSync);
    tcu::ThreadUtil::Thread::addOperation(&pEVar2->super_Thread,(Operation *)pRVar15);
    pSVar3 = local_148.m_state;
    if (local_148.m_state != (SharedPtrStateBase *)0x0) {
      LOCK();
      pdVar1 = &(local_148.m_state)->strongRefCount;
      *pdVar1 = *pdVar1 + -1;
      UNLOCK();
      if (*pdVar1 == 0) {
        local_148.m_ptr = (Texture *)0x0;
        (*(local_148.m_state)->_vptr_SharedPtrStateBase[2])(local_148.m_state);
      }
      LOCK();
      pdVar1 = &pSVar3->weakRefCount;
      *pdVar1 = *pdVar1 + -1;
      UNLOCK();
      if (*pdVar1 == 0) {
        if (local_148.m_state != (SharedPtrStateBase *)0x0) {
          (*(local_148.m_state)->_vptr_SharedPtrStateBase[1])();
        }
        local_148.m_state = (SharedPtrStateBase *)0x0;
      }
    }
    pSVar3 = local_138.m_state;
    if (local_138.m_state != (SharedPtrStateBase *)0x0) {
      LOCK();
      pdVar1 = &(local_138.m_state)->strongRefCount;
      *pdVar1 = *pdVar1 + -1;
      UNLOCK();
      if (*pdVar1 == 0) {
        local_138.m_ptr = (Program *)0x0;
        (*(local_138.m_state)->_vptr_SharedPtrStateBase[2])(local_138.m_state);
      }
      LOCK();
      pdVar1 = &pSVar3->weakRefCount;
      *pdVar1 = *pdVar1 + -1;
      UNLOCK();
      if (*pdVar1 == 0) {
        if (local_138.m_state != (SharedPtrStateBase *)0x0) {
          (*(local_138.m_state)->_vptr_SharedPtrStateBase[1])();
        }
        local_138.m_state = (SharedPtrStateBase *)0x0;
      }
    }
    pEVar2 = *(this->m_threads).
              super__Vector_base<deqp::egl::GLES2ThreadTest::EGLThread_*,_std::allocator<deqp::egl::GLES2ThreadTest::EGLThread_*>_>
              ._M_impl.super__Vector_impl_data._M_start;
    pRVar16 = (ReadPixels *)operator_new(0x90);
    GLES2ThreadTest::ReadPixels::ReadPixels
              (pRVar16,0,0,400,400,0x1908,0x1401,&pixels1,(this->m_config).useFenceSync,
               (this->m_config).serverSync);
    tcu::ThreadUtil::Thread::addOperation(&pEVar2->super_Thread,(Operation *)pRVar16);
    pEVar2 = (this->m_threads).
             super__Vector_base<deqp::egl::GLES2ThreadTest::EGLThread_*,_std::allocator<deqp::egl::GLES2ThreadTest::EGLThread_*>_>
             ._M_impl.super__Vector_impl_data._M_start[1];
    pRVar16 = (ReadPixels *)operator_new(0x90);
    GLES2ThreadTest::ReadPixels::ReadPixels
              (pRVar16,0,0,400,400,0x1908,0x1401,&pixels2,(this->m_config).useFenceSync,
               (this->m_config).serverSync);
    tcu::ThreadUtil::Thread::addOperation(&pEVar2->super_Thread,(Operation *)pRVar16);
    pEVar2 = *(this->m_threads).
              super__Vector_base<deqp::egl::GLES2ThreadTest::EGLThread_*,_std::allocator<deqp::egl::GLES2ThreadTest::EGLThread_*>_>
              ._M_impl.super__Vector_impl_data._M_start;
    this_03 = (CompareData *)operator_new(0x58);
    local_1a8.m_ptr = pixels1.m_ptr;
    local_1a8.m_state = pixels1.m_state;
    if (pixels1.m_state != (SharedPtrStateBase *)0x0) {
      LOCK();
      (pixels1.m_state)->strongRefCount = (pixels1.m_state)->strongRefCount + 1;
      UNLOCK();
      LOCK();
      (pixels1.m_state)->weakRefCount = (pixels1.m_state)->weakRefCount + 1;
      UNLOCK();
    }
    local_1b8.m_ptr = pixels2.m_ptr;
    local_1b8.m_state = pixels2.m_state;
    if (pixels2.m_state != (SharedPtrStateBase *)0x0) {
      LOCK();
      (pixels2.m_state)->strongRefCount = (pixels2.m_state)->strongRefCount + 1;
      UNLOCK();
      LOCK();
      (pixels2.m_state)->weakRefCount = (pixels2.m_state)->weakRefCount + 1;
      UNLOCK();
    }
    tcu::ThreadUtil::CompareData::CompareData(this_03,&local_1a8,&local_1b8);
    tcu::ThreadUtil::Thread::addOperation(&pEVar2->super_Thread,(Operation *)this_03);
    if (local_1b8.m_state != (SharedPtrStateBase *)0x0) {
      LOCK();
      pdVar1 = &(local_1b8.m_state)->strongRefCount;
      *pdVar1 = *pdVar1 + -1;
      UNLOCK();
      if (*pdVar1 == 0) {
        local_1b8.m_ptr = (DataBlock *)0x0;
        (*(local_1b8.m_state)->_vptr_SharedPtrStateBase[2])();
      }
      LOCK();
      pdVar1 = &(local_1b8.m_state)->weakRefCount;
      *pdVar1 = *pdVar1 + -1;
      UNLOCK();
      if (*pdVar1 == 0) {
        if (local_1b8.m_state != (SharedPtrStateBase *)0x0) {
          (*(local_1b8.m_state)->_vptr_SharedPtrStateBase[1])();
        }
        local_1b8.m_state = (SharedPtrStateBase *)0x0;
      }
    }
    if (local_1a8.m_state != (SharedPtrStateBase *)0x0) {
      LOCK();
      pdVar1 = &(local_1a8.m_state)->strongRefCount;
      *pdVar1 = *pdVar1 + -1;
      UNLOCK();
      if (*pdVar1 == 0) {
        local_1a8.m_ptr = (DataBlock *)0x0;
        (*(local_1a8.m_state)->_vptr_SharedPtrStateBase[2])();
      }
      LOCK();
      pdVar1 = &(local_1a8.m_state)->weakRefCount;
      *pdVar1 = *pdVar1 + -1;
      UNLOCK();
      if (*pdVar1 == 0) {
        if (local_1a8.m_state != (SharedPtrStateBase *)0x0) {
          (*(local_1a8.m_state)->_vptr_SharedPtrStateBase[1])();
        }
        local_1a8.m_state = (SharedPtrStateBase *)0x0;
      }
    }
    pSVar3 = pixels2.m_state;
    if (pixels2.m_state != (SharedPtrStateBase *)0x0) {
      LOCK();
      pdVar1 = &(pixels2.m_state)->strongRefCount;
      *pdVar1 = *pdVar1 + -1;
      UNLOCK();
      if (*pdVar1 == 0) {
        pixels2.m_ptr = (DataBlock *)0x0;
        (*(pixels2.m_state)->_vptr_SharedPtrStateBase[2])(pixels2.m_state);
      }
      LOCK();
      pdVar1 = &pSVar3->weakRefCount;
      *pdVar1 = *pdVar1 + -1;
      UNLOCK();
      if ((*pdVar1 == 0) && (pixels2.m_state != (SharedPtrStateBase *)0x0)) {
        (*(pixels2.m_state)->_vptr_SharedPtrStateBase[1])();
      }
    }
    pSVar3 = pixels1.m_state;
    if (pixels1.m_state != (SharedPtrStateBase *)0x0) {
      LOCK();
      pdVar1 = &(pixels1.m_state)->strongRefCount;
      *pdVar1 = *pdVar1 + -1;
      UNLOCK();
      if (*pdVar1 == 0) {
        pixels1.m_ptr = (DataBlock *)0x0;
        (*(pixels1.m_state)->_vptr_SharedPtrStateBase[2])(pixels1.m_state);
      }
      LOCK();
      pdVar1 = &pSVar3->weakRefCount;
      *pdVar1 = *pdVar1 + -1;
      UNLOCK();
      if ((*pdVar1 == 0) && (pixels1.m_state != (SharedPtrStateBase *)0x0)) {
        (*(pixels1.m_state)->_vptr_SharedPtrStateBase[1])();
      }
    }
  }
  if (((this->m_config).modify == 0) && ((this->m_config).render != true)) {
    pEVar2 = (this->m_threads).
             super__Vector_base<deqp::egl::GLES2ThreadTest::EGLThread_*,_std::allocator<deqp::egl::GLES2ThreadTest::EGLThread_*>_>
             ._M_impl.super__Vector_impl_data._M_start[1];
    pDVar17 = (DeleteTexture *)operator_new(0x78);
    local_1d8.m_ptr = texture.m_ptr;
    local_1d8.m_state = texture.m_state;
    if (texture.m_state != (SharedPtrStateBase *)0x0) {
      LOCK();
      (texture.m_state)->strongRefCount = (texture.m_state)->strongRefCount + 1;
      UNLOCK();
      LOCK();
      (texture.m_state)->weakRefCount = (texture.m_state)->weakRefCount + 1;
      UNLOCK();
    }
    GLES2ThreadTest::DeleteTexture::DeleteTexture
              (pDVar17,&local_1d8,(this->m_config).useFenceSync,(this->m_config).serverSync);
    tcu::ThreadUtil::Thread::addOperation(&pEVar2->super_Thread,(Operation *)pDVar17);
    if (local_1d8.m_state == (SharedPtrStateBase *)0x0) goto LAB_001d49ca;
    LOCK();
    pdVar1 = &(local_1d8.m_state)->strongRefCount;
    *pdVar1 = *pdVar1 + -1;
    UNLOCK();
    if (*pdVar1 == 0) {
      local_1d8.m_ptr = (Texture *)0x0;
      (*(local_1d8.m_state)->_vptr_SharedPtrStateBase[2])();
    }
    LOCK();
    pdVar1 = &(local_1d8.m_state)->weakRefCount;
    *pdVar1 = *pdVar1 + -1;
    UNLOCK();
    if (*pdVar1 != 0) goto LAB_001d49ca;
    pSVar5 = &local_1d8;
  }
  else {
    pEVar2 = *(this->m_threads).
              super__Vector_base<deqp::egl::GLES2ThreadTest::EGLThread_*,_std::allocator<deqp::egl::GLES2ThreadTest::EGLThread_*>_>
              ._M_impl.super__Vector_impl_data._M_start;
    pDVar17 = (DeleteTexture *)operator_new(0x78);
    local_1c8.m_ptr = texture.m_ptr;
    local_1c8.m_state = texture.m_state;
    if (texture.m_state != (SharedPtrStateBase *)0x0) {
      LOCK();
      (texture.m_state)->strongRefCount = (texture.m_state)->strongRefCount + 1;
      UNLOCK();
      LOCK();
      (texture.m_state)->weakRefCount = (texture.m_state)->weakRefCount + 1;
      UNLOCK();
    }
    GLES2ThreadTest::DeleteTexture::DeleteTexture
              (pDVar17,&local_1c8,(this->m_config).useFenceSync,(this->m_config).serverSync);
    tcu::ThreadUtil::Thread::addOperation(&pEVar2->super_Thread,(Operation *)pDVar17);
    if (local_1c8.m_state == (SharedPtrStateBase *)0x0) goto LAB_001d49ca;
    LOCK();
    pdVar1 = &(local_1c8.m_state)->strongRefCount;
    *pdVar1 = *pdVar1 + -1;
    UNLOCK();
    if (*pdVar1 == 0) {
      local_1c8.m_ptr = (Texture *)0x0;
      (*(local_1c8.m_state)->_vptr_SharedPtrStateBase[2])();
    }
    LOCK();
    pdVar1 = &(local_1c8.m_state)->weakRefCount;
    *pdVar1 = *pdVar1 + -1;
    UNLOCK();
    if (*pdVar1 != 0) goto LAB_001d49ca;
    pSVar5 = &local_1c8;
  }
  pSVar3 = pSVar5->m_state;
  if (pSVar3 != (SharedPtrStateBase *)0x0) {
    (*pSVar3->_vptr_SharedPtrStateBase[1])();
  }
  pSVar5->m_state = (SharedPtrStateBase *)0x0;
LAB_001d49ca:
  if ((this->m_config).render == true) {
    pEVar2 = *(this->m_threads).
              super__Vector_base<deqp::egl::GLES2ThreadTest::EGLThread_*,_std::allocator<deqp::egl::GLES2ThreadTest::EGLThread_*>_>
              ._M_impl.super__Vector_impl_data._M_start;
    pDVar18 = (DeleteShader *)operator_new(0x78);
    local_1e8.m_ptr = vertexShader.m_ptr;
    local_1e8.m_state = vertexShader.m_state;
    if (vertexShader.m_state != (SharedPtrStateBase *)0x0) {
      LOCK();
      (vertexShader.m_state)->strongRefCount = (vertexShader.m_state)->strongRefCount + 1;
      UNLOCK();
      LOCK();
      (vertexShader.m_state)->weakRefCount = (vertexShader.m_state)->weakRefCount + 1;
      UNLOCK();
    }
    GLES2ThreadTest::DeleteShader::DeleteShader
              (pDVar18,&local_1e8,(this->m_config).useFenceSync,(this->m_config).serverSync);
    tcu::ThreadUtil::Thread::addOperation(&pEVar2->super_Thread,(Operation *)pDVar18);
    if (local_1e8.m_state != (SharedPtrStateBase *)0x0) {
      LOCK();
      pdVar1 = &(local_1e8.m_state)->strongRefCount;
      *pdVar1 = *pdVar1 + -1;
      UNLOCK();
      if (*pdVar1 == 0) {
        local_1e8.m_ptr = (Shader *)0x0;
        (*(local_1e8.m_state)->_vptr_SharedPtrStateBase[2])();
      }
      LOCK();
      pdVar1 = &(local_1e8.m_state)->weakRefCount;
      *pdVar1 = *pdVar1 + -1;
      UNLOCK();
      if (*pdVar1 == 0) {
        if (local_1e8.m_state != (SharedPtrStateBase *)0x0) {
          (*(local_1e8.m_state)->_vptr_SharedPtrStateBase[1])();
        }
        local_1e8.m_state = (SharedPtrStateBase *)0x0;
      }
    }
    pEVar2 = *(this->m_threads).
              super__Vector_base<deqp::egl::GLES2ThreadTest::EGLThread_*,_std::allocator<deqp::egl::GLES2ThreadTest::EGLThread_*>_>
              ._M_impl.super__Vector_impl_data._M_start;
    pDVar18 = (DeleteShader *)operator_new(0x78);
    local_1f8.m_ptr = fragmentShader.m_ptr;
    local_1f8.m_state = fragmentShader.m_state;
    if (fragmentShader.m_state != (SharedPtrStateBase *)0x0) {
      LOCK();
      (fragmentShader.m_state)->strongRefCount = (fragmentShader.m_state)->strongRefCount + 1;
      UNLOCK();
      LOCK();
      (fragmentShader.m_state)->weakRefCount = (fragmentShader.m_state)->weakRefCount + 1;
      UNLOCK();
    }
    GLES2ThreadTest::DeleteShader::DeleteShader
              (pDVar18,&local_1f8,(this->m_config).useFenceSync,(this->m_config).serverSync);
    tcu::ThreadUtil::Thread::addOperation(&pEVar2->super_Thread,(Operation *)pDVar18);
    if (local_1f8.m_state != (SharedPtrStateBase *)0x0) {
      LOCK();
      pdVar1 = &(local_1f8.m_state)->strongRefCount;
      *pdVar1 = *pdVar1 + -1;
      UNLOCK();
      if (*pdVar1 == 0) {
        local_1f8.m_ptr = (Shader *)0x0;
        (*(local_1f8.m_state)->_vptr_SharedPtrStateBase[2])();
      }
      LOCK();
      pdVar1 = &(local_1f8.m_state)->weakRefCount;
      *pdVar1 = *pdVar1 + -1;
      UNLOCK();
      if (*pdVar1 == 0) {
        if (local_1f8.m_state != (SharedPtrStateBase *)0x0) {
          (*(local_1f8.m_state)->_vptr_SharedPtrStateBase[1])();
        }
        local_1f8.m_state = (SharedPtrStateBase *)0x0;
      }
    }
    pEVar2 = *(this->m_threads).
              super__Vector_base<deqp::egl::GLES2ThreadTest::EGLThread_*,_std::allocator<deqp::egl::GLES2ThreadTest::EGLThread_*>_>
              ._M_impl.super__Vector_impl_data._M_start;
    this_04 = (DeleteProgram *)operator_new(0x78);
    local_208.m_ptr = program.m_ptr;
    local_208.m_state = program.m_state;
    if (program.m_state != (SharedPtrStateBase *)0x0) {
      LOCK();
      (program.m_state)->strongRefCount = (program.m_state)->strongRefCount + 1;
      UNLOCK();
      LOCK();
      (program.m_state)->weakRefCount = (program.m_state)->weakRefCount + 1;
      UNLOCK();
    }
    GLES2ThreadTest::DeleteProgram::DeleteProgram
              (this_04,&local_208,(this->m_config).useFenceSync,(this->m_config).serverSync);
    tcu::ThreadUtil::Thread::addOperation(&pEVar2->super_Thread,(Operation *)this_04);
    if (local_208.m_state != (SharedPtrStateBase *)0x0) {
      LOCK();
      pdVar1 = &(local_208.m_state)->strongRefCount;
      *pdVar1 = *pdVar1 + -1;
      UNLOCK();
      if (*pdVar1 == 0) {
        local_208.m_ptr = (Program *)0x0;
        (*(local_208.m_state)->_vptr_SharedPtrStateBase[2])();
      }
      LOCK();
      pdVar1 = &(local_208.m_state)->weakRefCount;
      *pdVar1 = *pdVar1 + -1;
      UNLOCK();
      if (*pdVar1 == 0) {
        if (local_208.m_state != (SharedPtrStateBase *)0x0) {
          (*(local_208.m_state)->_vptr_SharedPtrStateBase[1])();
        }
        local_208.m_state = (SharedPtrStateBase *)0x0;
      }
    }
  }
  pSVar3 = texture.m_state;
  if (texture.m_state != (SharedPtrStateBase *)0x0) {
    LOCK();
    pdVar1 = &(texture.m_state)->strongRefCount;
    *pdVar1 = *pdVar1 + -1;
    UNLOCK();
    if (*pdVar1 == 0) {
      texture.m_ptr = (Texture *)0x0;
      (*(texture.m_state)->_vptr_SharedPtrStateBase[2])(texture.m_state);
    }
    LOCK();
    pdVar1 = &pSVar3->weakRefCount;
    *pdVar1 = *pdVar1 + -1;
    UNLOCK();
    if ((*pdVar1 == 0) && (texture.m_state != (SharedPtrStateBase *)0x0)) {
      (*(texture.m_state)->_vptr_SharedPtrStateBase[1])();
    }
  }
  pSVar3 = program.m_state;
  if (program.m_state != (SharedPtrStateBase *)0x0) {
    LOCK();
    pdVar1 = &(program.m_state)->strongRefCount;
    *pdVar1 = *pdVar1 + -1;
    UNLOCK();
    if (*pdVar1 == 0) {
      program.m_ptr = (Program *)0x0;
      (*(program.m_state)->_vptr_SharedPtrStateBase[2])(program.m_state);
    }
    LOCK();
    pdVar1 = &pSVar3->weakRefCount;
    *pdVar1 = *pdVar1 + -1;
    UNLOCK();
    if ((*pdVar1 == 0) && (program.m_state != (SharedPtrStateBase *)0x0)) {
      (*(program.m_state)->_vptr_SharedPtrStateBase[1])();
    }
  }
  pSVar3 = fragmentShader.m_state;
  if (fragmentShader.m_state != (SharedPtrStateBase *)0x0) {
    LOCK();
    pdVar1 = &(fragmentShader.m_state)->strongRefCount;
    *pdVar1 = *pdVar1 + -1;
    UNLOCK();
    if (*pdVar1 == 0) {
      fragmentShader.m_ptr = (Shader *)0x0;
      (*(fragmentShader.m_state)->_vptr_SharedPtrStateBase[2])(fragmentShader.m_state);
    }
    LOCK();
    pdVar1 = &pSVar3->weakRefCount;
    *pdVar1 = *pdVar1 + -1;
    UNLOCK();
    if ((*pdVar1 == 0) && (fragmentShader.m_state != (SharedPtrStateBase *)0x0)) {
      (*(fragmentShader.m_state)->_vptr_SharedPtrStateBase[1])();
    }
  }
  pSVar3 = vertexShader.m_state;
  if (vertexShader.m_state != (SharedPtrStateBase *)0x0) {
    LOCK();
    pdVar1 = &(vertexShader.m_state)->strongRefCount;
    *pdVar1 = *pdVar1 + -1;
    UNLOCK();
    if (*pdVar1 == 0) {
      vertexShader.m_ptr = (Shader *)0x0;
      (*(vertexShader.m_state)->_vptr_SharedPtrStateBase[2])(vertexShader.m_state);
    }
    LOCK();
    pdVar1 = &pSVar3->weakRefCount;
    *pdVar1 = *pdVar1 + -1;
    UNLOCK();
    if ((*pdVar1 == 0) && (vertexShader.m_state != (SharedPtrStateBase *)0x0)) {
      (*(vertexShader.m_state)->_vptr_SharedPtrStateBase[1])();
    }
  }
  return;
}

Assistant:

void GLES2ThreadedSharingTest::addTextureOperations (void)
{
	// Add operations for verify
	SharedPtr<GLES2ThreadTest::Shader>	vertexShader;
	SharedPtr<GLES2ThreadTest::Shader>	fragmentShader;
	SharedPtr<GLES2ThreadTest::Program>	program;

	if (m_config.render)
	{
		const char* vertexShaderSource =
		"attribute highp vec2 a_pos;\n"
		"varying mediump vec2 v_pos;\n"
		"void main(void)\n"
		"{\n"
		"\tv_pos = a_pos;\n"
		"\tgl_Position = vec4(a_pos, 0.0, 1.0);\n"
		"}\n";

		const char* fragmentShaderSource =
		"varying mediump vec2 v_pos;\n"
		"uniform sampler2D u_sampler;\n"
		"void main(void)\n"
		"{\n"
		"\tgl_FragColor = texture2D(u_sampler, v_pos);\n"
		"}\n";

		m_threads[0]->addOperation(new GLES2ThreadTest::CreateShader(GL_VERTEX_SHADER, vertexShader, m_config.useFenceSync, m_config.serverSync));
		m_threads[0]->addOperation(new GLES2ThreadTest::ShaderSource(vertexShader, vertexShaderSource, m_config.useFenceSync, m_config.serverSync));
		m_threads[0]->addOperation(new GLES2ThreadTest::ShaderCompile(vertexShader, m_config.useFenceSync, m_config.serverSync));

		m_threads[0]->addOperation(new GLES2ThreadTest::CreateShader(GL_FRAGMENT_SHADER, fragmentShader, m_config.useFenceSync, m_config.serverSync));
		m_threads[0]->addOperation(new GLES2ThreadTest::ShaderSource(fragmentShader, fragmentShaderSource, m_config.useFenceSync, m_config.serverSync));
		m_threads[0]->addOperation(new GLES2ThreadTest::ShaderCompile(fragmentShader, m_config.useFenceSync, m_config.serverSync));

		m_threads[0]->addOperation(new GLES2ThreadTest::CreateProgram(program, m_config.useFenceSync, m_config.serverSync));
		m_threads[0]->addOperation(new GLES2ThreadTest::AttachShader(program, fragmentShader, m_config.useFenceSync, m_config.serverSync));
		m_threads[0]->addOperation(new GLES2ThreadTest::AttachShader(program, vertexShader, m_config.useFenceSync, m_config.serverSync));

		m_threads[0]->addOperation(new GLES2ThreadTest::LinkProgram(program, m_config.useFenceSync, m_config.serverSync));
	}

	SharedPtr<GLES2ThreadTest::Texture> texture;

	m_threads[0]->addOperation(new GLES2ThreadTest::CreateTexture(texture, m_config.useFenceSync, m_config.serverSync));

	if (m_config.define == 1)
	{
		if (m_config.modify || m_config.render)
			m_threads[0]->addOperation(new GLES2ThreadTest::TexImage2D(texture, 0, GL_RGBA, 256, 256, GL_RGBA, GL_UNSIGNED_BYTE, m_config.useFenceSync, m_config.serverSync));
		else
			m_threads[1]->addOperation(new GLES2ThreadTest::TexImage2D(texture, 0, GL_RGBA, 256, 256, GL_RGBA, GL_UNSIGNED_BYTE, m_config.useFenceSync, m_config.serverSync));
	}

	if (m_config.define == 2)
	{
		if (m_config.modify || m_config.render)
			m_threads[0]->addOperation(new GLES2ThreadTest::CopyTexImage2D(texture, 0, GL_RGBA, 17, 17, 256, 256, 0, m_config.useFenceSync, m_config.serverSync));
		else
			m_threads[1]->addOperation(new GLES2ThreadTest::CopyTexImage2D(texture, 0, GL_RGBA, 17, 17, 256, 256, 0, m_config.useFenceSync, m_config.serverSync));
	}

	if (m_config.modify == 1)
	{
		if (m_config.render)
			m_threads[0]->addOperation(new GLES2ThreadTest::TexSubImage2D(texture, 0, 17, 17, 29, 29, GL_RGBA, GL_UNSIGNED_BYTE, m_config.useFenceSync, m_config.serverSync));
		else
			m_threads[1]->addOperation(new GLES2ThreadTest::TexSubImage2D(texture, 0, 17, 17, 29, 29, GL_RGBA, GL_UNSIGNED_BYTE, m_config.useFenceSync, m_config.serverSync));
	}

	if (m_config.modify == 2)
	{
		if (m_config.render)
			m_threads[0]->addOperation(new GLES2ThreadTest::CopyTexSubImage2D(texture, 0, 7, 7, 17, 17, 29, 29, m_config.useFenceSync, m_config.serverSync));
		else
			m_threads[1]->addOperation(new GLES2ThreadTest::CopyTexSubImage2D(texture, 0, 7, 7, 17, 17, 29, 29, m_config.useFenceSync, m_config.serverSync));
	}

	if (m_config.render)
	{
		SharedPtr<tcu::ThreadUtil::DataBlock> pixels1;
		SharedPtr<tcu::ThreadUtil::DataBlock> pixels2;

		m_threads[0]->addOperation(new GLES2ThreadTest::RenderTexture(program, texture, m_config.useFenceSync, m_config.serverSync));
		m_threads[1]->addOperation(new GLES2ThreadTest::RenderTexture(program, texture, m_config.useFenceSync, m_config.serverSync));

		m_threads[0]->addOperation(new GLES2ThreadTest::ReadPixels(0, 0, 400, 400, GL_RGBA, GL_UNSIGNED_BYTE, pixels1, m_config.useFenceSync, m_config.serverSync));
		m_threads[1]->addOperation(new GLES2ThreadTest::ReadPixels(0, 0, 400, 400, GL_RGBA, GL_UNSIGNED_BYTE, pixels2, m_config.useFenceSync, m_config.serverSync));

		m_threads[0]->addOperation(new tcu::ThreadUtil::CompareData(pixels1, pixels2));
	}

	if (m_config.modify || m_config.render)
		m_threads[0]->addOperation(new GLES2ThreadTest::DeleteTexture(texture, m_config.useFenceSync, m_config.serverSync));
	else
		m_threads[1]->addOperation(new GLES2ThreadTest::DeleteTexture(texture, m_config.useFenceSync, m_config.serverSync));

	if (m_config.render)
	{
		m_threads[0]->addOperation(new GLES2ThreadTest::DeleteShader(vertexShader, m_config.useFenceSync, m_config.serverSync));
		m_threads[0]->addOperation(new GLES2ThreadTest::DeleteShader(fragmentShader, m_config.useFenceSync, m_config.serverSync));
		m_threads[0]->addOperation(new GLES2ThreadTest::DeleteProgram(program, m_config.useFenceSync, m_config.serverSync));
	}
}